

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlNewNsPropEatName(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value)

{
  xmlChar *value_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  
  if (name == (xmlChar *)0x0) {
    node_local = (xmlNodePtr)0x0;
  }
  else {
    node_local = (xmlNodePtr)xmlNewPropInternal(node,ns,name,value,1);
  }
  return (xmlAttrPtr)node_local;
}

Assistant:

xmlAttrPtr
xmlNewNsPropEatName(xmlNodePtr node, xmlNsPtr ns, xmlChar *name,
           const xmlChar *value) {

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewNsPropEatName : name == NULL\n");
#endif
	return(NULL);
    }

    return xmlNewPropInternal(node, ns, name, value, 1);
}